

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

BufferWithRandomAccess * __thiscall
wasm::BufferWithRandomAccess::operator<<(BufferWithRandomAccess *this,S64LEB x)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  byte *pbVar4;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  ulong local_28;
  size_t i;
  size_t before;
  BufferWithRandomAccess *this_local;
  S64LEB x_local;
  
  i = 0xffffffffffffffff;
  this_local = (BufferWithRandomAccess *)x.value;
  bVar1 = isDebugEnabled("binary");
  __buf = extraout_RDX;
  if (bVar1) {
    i = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    poVar3 = std::operator<<((ostream *)&std::cerr,"writeS64LEB: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(long)this_local);
    poVar3 = std::operator<<(poVar3," (at ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,i);
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __buf = extraout_RDX_00;
  }
  LEB<long,_signed_char>::write((LEB<long,_signed_char> *)&this_local,(int)this,__buf,in_RCX);
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    for (local_28 = i;
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>),
        local_28 < sVar2; local_28 = local_28 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"  ");
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                          local_28);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*pbVar4);
      poVar3 = std::operator<<(poVar3," (at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
      std::operator<<(poVar3,")\n");
    }
  }
  return this;
}

Assistant:

BufferWithRandomAccess& operator<<(S64LEB x) {
    [[maybe_unused]] size_t before = -1;
    BYN_DEBUG(before = size(); std::cerr << "writeS64LEB: " << x.value
                                         << " (at " << before << ")"
                                         << std::endl;);
    x.write(this);
    BYN_DEBUG(for (size_t i = before; i < size(); i++) {
      std::cerr << "  " << (int)at(i) << " (at " << i << ")\n";
    });
    return *this;
  }